

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O2

Instr * __thiscall IR::Instr::GetBlockStartInstr(Instr *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Instr *pIVar4;
  
  pIVar4 = this->m_prev;
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  while ((6 < pIVar4->m_kind || ((0x68U >> (pIVar4->m_kind & 0x1f) & 1) == 0))) {
    pIVar4 = pIVar4->m_prev;
    if (pIVar4 == (Instr *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                         ,0xb6f,"(instr)","GetBlockStartInstr() failed...");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
  }
  return pIVar4;
}

Assistant:

IR::Instr *
Instr::GetBlockStartInstr() const
{
    IR::Instr *instr = this->m_prev;

    while (!instr->StartsBasicBlock())
    {
        instr = instr->m_prev;
        AssertMsg(instr, "GetBlockStartInstr() failed...");
    }
    return instr;
}